

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O1

void * __thiscall RelocBlockWrapper::getPtr(RelocBlockWrapper *this)

{
  RelocDirWrapper *this_00;
  Executable *pEVar1;
  long lVar2;
  int iVar3;
  offset_t oVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar8;
  void *pvVar9;
  bool bVar10;
  void *pvVar5;
  
  this_00 = this->parentDir;
  if (this_00 == (RelocDirWrapper *)0x0) {
    pvVar9 = (void *)0x0;
  }
  else {
    oVar4 = DataDirEntryWrapper::getDirEntryAddress(&this_00->super_DataDirEntryWrapper);
    pEVar1 = (this_00->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    pvVar9 = (void *)0x0;
    iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar4,2,8,0);
    pvVar5 = (void *)CONCAT44(extraout_var,iVar3);
    if (pvVar5 != (void *)0x0) {
      if (this->cachedRaw != 0xffffffffffffffff) {
        pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar1,this->cachedRaw,1,8,0);
        return (void *)CONCAT44(extraout_var_00,iVar3);
      }
      iVar3 = (*(this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.
                super_ExeNodeWrapper.super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x20])
                        (this->parentDir,(this->super_ExeNodeWrapper).entryNum - 1);
      if (CONCAT44(extraout_var_01,iVar3) == 0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(CONCAT44(extraout_var_01,iVar3),&ExeNodeWrapper::typeinfo,
                                        &typeinfo,0);
      }
      if (plVar6 != (long *)0x0) {
        lVar2 = plVar6[8];
        lVar7 = (**(code **)(*plVar6 + 0x60))(plVar6);
        bVar10 = true;
        if (lVar2 != -1) {
          oVar4 = lVar2 + (ulong)*(uint *)(lVar7 + 4);
          pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
          iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                            (pEVar1,oVar4,1,8,0);
          if ((void *)CONCAT44(extraout_var_02,iVar3) != (void *)0x0) {
            this->cachedRaw = oVar4;
            bVar10 = false;
            pvVar9 = (void *)CONCAT44(extraout_var_02,iVar3);
          }
        }
        if (!bVar10) {
          return pvVar9;
        }
      }
      iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,pvVar5,0);
      oVar4 = CONCAT44(extraout_var_03,iVar3);
      bVar10 = (this->super_ExeNodeWrapper).entryNum != 0;
      if (bVar10) {
        oVar4 = oVar4 + *(uint *)((long)pvVar5 + 4);
        pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar1,oVar4,1,8,0);
        pvVar5 = (void *)CONCAT44(extraout_var_04,iVar3);
        if (pvVar5 != (void *)0x0) {
          uVar8 = 0;
          do {
            uVar8 = uVar8 + 1;
            bVar10 = uVar8 < (this->super_ExeNodeWrapper).entryNum;
            if (!bVar10) goto LAB_00137a08;
            oVar4 = oVar4 + *(uint *)((long)pvVar5 + 4);
            pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
            iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                              (pEVar1,oVar4,1,8,0);
            pvVar5 = (void *)CONCAT44(extraout_var_05,iVar3);
          } while (pvVar5 != (void *)0x0);
        }
        pvVar5 = (void *)0x0;
        pvVar9 = (void *)0x0;
      }
LAB_00137a08:
      if (!bVar10) {
        this->cachedRaw = oVar4;
        pvVar9 = pvVar5;
      }
    }
  }
  return pvVar9;
}

Assistant:

void* RelocBlockWrapper::getPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_BASE_RELOCATION* reloc = this->parentDir->reloc();
    if (!reloc) return NULL;

    offset_t raw = INVALID_ADDR;
    BYTE *ptr = NULL;

    // use my cached:
    if (this->cachedRaw != INVALID_ADDR) {
        ptr = m_Exe->getContentAt(this->cachedRaw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        return ptr;
    }

    // use previous cached to calculate my cached
    size_t prevNum = this->entryNum - 1;

    RelocBlockWrapper *prevEntry = dynamic_cast<RelocBlockWrapper*> (this->parentDir->getEntryAt(prevNum));
    if (prevEntry) {
        offset_t prevRaw = prevEntry->cachedRaw;

        IMAGE_BASE_RELOCATION* prevReloc = (IMAGE_BASE_RELOCATION*) prevEntry->getPtr();
        raw = prevRaw + prevReloc->SizeOfBlock;

        if (prevRaw != INVALID_ADDR) {
            ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));

            if (ptr != NULL) {
                this->cachedRaw = raw;
                return ptr;
            }
        }
    }
    // previous cached not avaliable, calculate...
    offset_t firstRaw = this->getOffset(reloc);
    offset_t blockSize = reloc->SizeOfBlock;

    raw = firstRaw;
    ptr = (BYTE*) reloc;

    for ( size_t i = 0; i < this->entryNum; i++) { //TODO: make caching
        raw += blockSize;

        ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        if (!ptr) return NULL;

        reloc = (IMAGE_BASE_RELOCATION*) ptr;
        blockSize = reloc->SizeOfBlock;
    }

    this->cachedRaw = raw;
    return ptr;
}